

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

void __thiscall
cnn::KMaxPooling::forward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  int iVar28;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  float tmp [1024];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1078;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1058;
  float local_1038 [1026];
  
  Tensor::operator*(&local_1078,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_1058,fx);
  if (0x3ff < local_1078.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value) {
    __assert_fail("x.cols() < 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                  ,0x122,
                  "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar10 = (ulong)(uint)local_1078.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value;
  if (uVar10 == 0) {
    uVar12 = 0;
  }
  else {
    pvVar2 = (this->super_Node).aux_mem;
    uVar17 = (uint)local_1078.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
    uVar11 = local_1078.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value & 0xffffffff;
    lVar16 = 0;
    uVar12 = 0;
    uVar18 = 0;
    do {
      if (uVar17 != 0) {
        if (CONCAT44(local_1078.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value._4_4_,
                     (uint)local_1078.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value) <= (long)uVar18) goto LAB_0017d846;
        pfVar9 = (float *)((long)local_1078.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data + lVar16);
        lVar13 = 0;
        do {
          if (local_1078.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= lVar13) goto LAB_0017d846;
          local_1038[lVar13] = -*pfVar9;
          lVar13 = lVar13 + 1;
          pfVar9 = pfVar9 + CONCAT44(local_1078.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_rows.m_value._4_4_,
                                     (uint)local_1078.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_rows.m_value);
        } while (uVar17 != (uint)lVar13);
      }
      uVar8 = (ulong)(this->k - 1);
      if (uVar11 != uVar8 && uVar11 != 0) {
        std::__introselect<float*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_1038,local_1038 + uVar8,local_1038 + uVar11,(int)LZCOUNT(uVar11) * 2 ^ 0x7e
                  );
      }
      if (uVar17 != 0) {
        if (CONCAT44(local_1078.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value._4_4_,
                     (uint)local_1078.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value) <= (long)uVar18) {
LAB_0017d846:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                       );
        }
        fVar1 = local_1038[this->k - 1];
        pfVar9 = (float *)((long)local_1078.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data + lVar16);
        lVar13 = 0;
        uVar8 = 0;
        do {
          if (local_1078.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= lVar13) goto LAB_0017d846;
          bVar19 = true;
          if (-fVar1 <= *pfVar9) {
            if ((local_1058.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value <= (long)uVar18) ||
               (local_1058.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value <= (long)uVar8)) goto LAB_0017d846;
            local_1058.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data[uVar18 + uVar8 * local_1058.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_rows.m_value] = *pfVar9;
            uVar15 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
            *(int *)((long)pvVar2 + uVar15 * 4) = (int)lVar13;
            uVar14 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar14;
            bVar19 = uVar14 != this->k;
          }
          if (!bVar19) break;
          lVar13 = lVar13 + 1;
          pfVar9 = pfVar9 + CONCAT44(local_1078.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_rows.m_value._4_4_,
                                     (uint)local_1078.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_rows.m_value);
        } while ((uint)lVar13 < uVar17);
      }
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 4;
    } while (uVar18 != uVar10);
  }
  uVar10 = (ulong)(this->super_Node).dim.nd;
  if (uVar10 == 0) {
    iVar28 = 1;
  }
  else {
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vmovdqa64_avx512f(auVar23);
      auVar23 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar23,auVar24);
      auVar23 = vporq_avx512f(auVar23,auVar25);
      uVar5 = vpcmpuq_avx512f(auVar23,auVar22,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar27,auVar22,2);
      bVar7 = (byte)uVar5;
      uVar20 = CONCAT11(bVar7,bVar6);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->super_Node).dim.d + uVar11));
      auVar27._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar23._4_4_;
      auVar27._0_4_ = (uint)(bVar6 & 1) * auVar23._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar23._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar23._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar23._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar23._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar23._24_4_;
      auVar27._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar23._28_4_;
      auVar27._32_4_ = (uint)(bVar7 & 1) * auVar23._32_4_;
      auVar27._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar23._36_4_;
      auVar27._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar23._40_4_;
      auVar27._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar23._44_4_;
      auVar27._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar23._48_4_;
      auVar27._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar23._52_4_;
      auVar27._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar23._56_4_;
      auVar27._60_4_ = (uint)(bVar7 >> 7) * auVar23._60_4_;
      auVar23 = vpmulld_avx512f(auVar27,auVar26);
      uVar11 = uVar11 + 0x10;
    } while ((uVar10 + 0xf & 0xfffffffffffffff0) != uVar11);
    auVar22 = vmovdqa32_avx512f(auVar23);
    auVar23._0_4_ = (uint)(bVar6 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar26._0_4_;
    bVar19 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar19 * auVar22._4_4_ | (uint)!bVar19 * auVar26._4_4_;
    bVar19 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar19 * auVar22._8_4_ | (uint)!bVar19 * auVar26._8_4_;
    bVar19 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar19 * auVar22._12_4_ | (uint)!bVar19 * auVar26._12_4_;
    bVar19 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar19 * auVar22._16_4_ | (uint)!bVar19 * auVar26._16_4_;
    bVar19 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar19 * auVar22._20_4_ | (uint)!bVar19 * auVar26._20_4_;
    bVar19 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar19 * auVar22._24_4_ | (uint)!bVar19 * auVar26._24_4_;
    bVar19 = (bool)((byte)(uVar20 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar19 * auVar22._28_4_ | (uint)!bVar19 * auVar26._28_4_;
    auVar23._32_4_ = (uint)(bVar7 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar26._32_4_;
    bVar19 = (bool)(bVar7 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar19 * auVar22._36_4_ | (uint)!bVar19 * auVar26._36_4_;
    bVar19 = (bool)(bVar7 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar19 * auVar22._40_4_ | (uint)!bVar19 * auVar26._40_4_;
    bVar19 = (bool)(bVar7 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar19 * auVar22._44_4_ | (uint)!bVar19 * auVar26._44_4_;
    bVar19 = (bool)(bVar7 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar19 * auVar22._48_4_ | (uint)!bVar19 * auVar26._48_4_;
    bVar19 = (bool)(bVar7 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar19 * auVar22._52_4_ | (uint)!bVar19 * auVar26._52_4_;
    bVar19 = (bool)(bVar7 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar19 * auVar22._56_4_ | (uint)!bVar19 * auVar26._56_4_;
    auVar23._60_4_ =
         (uint)(bVar7 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar26._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar23,1);
    auVar22 = vpmulld_avx512f(auVar23,ZEXT3264(auVar21));
    auVar3 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    iVar28 = auVar3._0_4_;
  }
  if (uVar12 == iVar28 * (this->super_Node).dim.bd) {
    return;
  }
  __assert_fail("mi == dim.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                ,0x13b,
                "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void KMaxPooling::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::forward not implemented for CUDA");
#else
  auto x=**xs[0];
  auto y=*fx;
  float tmp[1024];
  assert(x.cols() < 1024);
  unsigned mi = 0;
  const unsigned rows = x.rows();
  const unsigned xcols = x.cols();
  int* maxmap = static_cast<int*>(aux_mem);
  for (unsigned i=0; i < rows; ++i) {
    //cerr << "row(" << i << ")=" << x.row(i) << endl;
    for (unsigned j=0; j < xcols; ++j)
      tmp[j] = -x(i,j);
    nth_element(tmp, tmp + (k-1), tmp + xcols);
    const float c = -tmp[k-1];  // kth largest element in row i
    unsigned tt = 0;
    for (unsigned j = 0; j < xcols; ++j) {
      const float xij = x(i,j);
      if (xij >= c) {
        //cerr << xij << ' ';
        y(i,tt) = xij;
        //assert(mi < dim.size());
        maxmap[mi++] = j;
        ++tt;
        if (tt == k) break;  // could happen in case of ties
      }
    }
    //cerr << endl; abort();
  }
  assert(mi == dim.size());
#endif
}